

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm1d_sse4.h
# Opt level: O0

void transpose_32_4x4(int stride,__m128i *input,__m128i *output)

{
  __m128i *palVar1;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 uStack_94;
  __m128i temp3;
  __m128i temp2;
  __m128i temp1;
  __m128i temp0;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  __m128i *output_local;
  __m128i *input_local;
  int stride_local;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_98 = (undefined4)(*input)[0];
  uStack_94 = (undefined4)((ulong)(*input)[0] >> 0x20);
  local_a8 = (undefined4)input[stride * 2][0];
  uStack_a4 = (undefined4)((ulong)input[stride * 2][0] >> 0x20);
  uStack_10 = (undefined4)(*input)[1];
  uStack_c = (undefined4)((ulong)(*input)[1] >> 0x20);
  uStack_20 = (undefined4)input[stride * 2][1];
  uStack_1c = (undefined4)((ulong)input[stride * 2][1] >> 0x20);
  local_b8 = (undefined4)input[stride][0];
  uStack_b4 = (undefined4)((ulong)input[stride][0] >> 0x20);
  local_c8 = (undefined4)input[stride * 3][0];
  uStack_c4 = (undefined4)((ulong)input[stride * 3][0] >> 0x20);
  input_local._0_4_ = (undefined4)input[stride][1];
  input_local._4_4_ = (undefined4)((ulong)input[stride][1] >> 0x20);
  uStack_40 = (undefined4)input[stride * 3][1];
  uStack_3c = (undefined4)((ulong)input[stride * 3][1] >> 0x20);
  *(undefined4 *)*output = local_98;
  *(undefined4 *)((long)*output + 4) = local_b8;
  *(undefined4 *)(*output + 1) = local_a8;
  *(undefined4 *)((long)*output + 0xc) = local_c8;
  palVar1 = output + stride;
  *(undefined4 *)*palVar1 = uStack_94;
  *(undefined4 *)((long)*palVar1 + 4) = uStack_b4;
  *(undefined4 *)(*palVar1 + 1) = uStack_a4;
  *(undefined4 *)((long)*palVar1 + 0xc) = uStack_c4;
  palVar1 = output + stride * 2;
  *(undefined4 *)*palVar1 = uStack_10;
  *(undefined4 *)((long)*palVar1 + 4) = input_local._0_4_;
  *(undefined4 *)(*palVar1 + 1) = uStack_20;
  *(undefined4 *)((long)*palVar1 + 0xc) = uStack_40;
  palVar1 = output + stride * 3;
  *(undefined4 *)*palVar1 = uStack_c;
  *(undefined4 *)((long)*palVar1 + 4) = input_local._4_4_;
  *(undefined4 *)(*palVar1 + 1) = uStack_1c;
  *(undefined4 *)((long)*palVar1 + 0xc) = uStack_3c;
  return;
}

Assistant:

static inline void transpose_32_4x4(int stride, const __m128i *input,
                                    __m128i *output) {
  __m128i temp0 = _mm_unpacklo_epi32(input[0 * stride], input[2 * stride]);
  __m128i temp1 = _mm_unpackhi_epi32(input[0 * stride], input[2 * stride]);
  __m128i temp2 = _mm_unpacklo_epi32(input[1 * stride], input[3 * stride]);
  __m128i temp3 = _mm_unpackhi_epi32(input[1 * stride], input[3 * stride]);

  output[0 * stride] = _mm_unpacklo_epi32(temp0, temp2);
  output[1 * stride] = _mm_unpackhi_epi32(temp0, temp2);
  output[2 * stride] = _mm_unpacklo_epi32(temp1, temp3);
  output[3 * stride] = _mm_unpackhi_epi32(temp1, temp3);
}